

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O0

ListServerInfo * __thiscall
RenX_ServerListPlugin::getListServerInfo
          (ListServerInfo *__return_storage_ptr__,RenX_ServerListPlugin *this,Server *server)

{
  char **ppcVar1;
  unsigned_short uVar2;
  ushort uVar3;
  string *this_00;
  Config *pCVar4;
  string local_a8;
  __sv_type local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  Config *local_60;
  Config *section;
  __sv_type local_48;
  undefined1 local_38 [8];
  anon_class_16_2_a2190fd3 populate_with_section;
  Server *server_local;
  RenX_ServerListPlugin *this_local;
  ListServerInfo *result;
  
  populate_with_section.result._7_1_ = 0;
  ListServerInfo::ListServerInfo(__return_storage_ptr__);
  local_38 = (undefined1  [8])server;
  populate_with_section.server = (Server *)__return_storage_ptr__;
  this_00 = (string *)RenX::Server::getSocketHostname_abi_cxx11_();
  local_48 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  (__return_storage_ptr__->hostname)._M_len = local_48._M_len;
  (__return_storage_ptr__->hostname)._M_str = local_48._M_str;
  uVar2 = RenX::Server::getPort();
  __return_storage_ptr__->port = uVar2;
  local_78 = (undefined4)(__return_storage_ptr__->hostname)._M_len;
  uStack_74 = *(undefined4 *)((long)&(__return_storage_ptr__->hostname)._M_len + 4);
  ppcVar1 = &(__return_storage_ptr__->hostname)._M_str;
  uStack_70 = *(undefined4 *)ppcVar1;
  uStack_6c = *(undefined4 *)((long)&(__return_storage_ptr__->hostname)._M_str + 4);
  local_60 = (Config *)
             Jupiter::Config::getSection
                       (&this->field_0x38,(__return_storage_ptr__->hostname)._M_len,*ppcVar1);
  if (local_60 != (Config *)0x0) {
    getListServerInfo::anon_class_16_2_a2190fd3::operator()
              ((anon_class_16_2_a2190fd3 *)local_38,local_60);
    pCVar4 = local_60;
    uVar3 = RenX::Server::getPort();
    string_printf_abi_cxx11_(&local_a8,"%u",(ulong)uVar3);
    local_88 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a8);
    pCVar4 = (Config *)Jupiter::Config::getSection(pCVar4,local_88._M_len,local_88._M_str);
    getListServerInfo::anon_class_16_2_a2190fd3::operator()
              ((anon_class_16_2_a2190fd3 *)local_38,pCVar4);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

RenX_ServerListPlugin::ListServerInfo RenX_ServerListPlugin::getListServerInfo(const RenX::Server& server) {
	ListServerInfo result;

	auto populate_with_section = [&server, &result](Jupiter::Config* section) {
		if (section == nullptr) {
			return;
		}

		result.hostname = section->get("ListAddress"sv, result.hostname);
		result.port = section->get("ListPort"sv, result.port);
		result.namePrefix = section->get("ListNamePrefix"sv, result.namePrefix);

		// Attributes
		std::string_view attributes_str = section->get("ListAttributes"sv);
		if (!attributes_str.empty()) {
			result.attributes = jessilib::split_view(attributes_str, ' ');
		}
	};

	// Populate with standard information
	result.hostname = server.getSocketHostname();
	result.port = server.getPort();

	// Try Overwriting based on IP-named config section
	if (auto section = config.getSection(result.hostname)) {
		populate_with_section(section);

		// Try overwriting based on Port subsection
		populate_with_section(section->getSection(string_printf("%u", server.getPort())));
	}

	return result;
}